

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtStretch5(uint *pInOut,int nVarS,int nVarB)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  ulong uVar6;
  
  if (nVarS != nVarB) {
    if (nVarB <= nVarS) {
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x46e,"void Abc_TtStretch5(unsigned int *, int, int)");
    }
    uVar4 = 1 << ((char)nVarS - 5U & 0x1f);
    if (nVarS < 6) {
      uVar4 = 1;
    }
    uVar3 = 1 << ((char)nVarB - 5U & 0x1f);
    if (nVarB < 6) {
      uVar3 = 1;
    }
    if (uVar4 != uVar3) {
      if ((int)uVar3 <= (int)uVar4) {
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x473,"void Abc_TtStretch5(unsigned int *, int, int)");
      }
      lVar1 = 0;
      uVar2 = 0;
      if (0 < (int)uVar4) {
        uVar2 = (ulong)uVar4;
      }
      puVar5 = pInOut;
      for (; lVar1 < (int)uVar3; lVar1 = lVar1 + (int)uVar4) {
        for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
          puVar5[uVar6] = pInOut[uVar6];
        }
        puVar5 = puVar5 + (int)uVar4;
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtStretch5( unsigned * pInOut, int nVarS, int nVarB )
{
    int w, i, step, nWords;
    if ( nVarS == nVarB )
        return;
    assert( nVarS < nVarB );
    step = Abc_TruthWordNum(nVarS);
    nWords = Abc_TruthWordNum(nVarB);
    if ( step == nWords )
        return;
    assert( step < nWords );
    for ( w = 0; w < nWords; w += step )
        for ( i = 0; i < step; i++ )
            pInOut[w + i] = pInOut[i];              
}